

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

void __thiscall
ON_ModelComponent::SetHiddenModelComponentState(ON_ModelComponent *this,bool bHiddenState)

{
  bool bVar1;
  bool bVar2;
  ON_ComponentStatus local_13;
  byte local_11;
  ON_ComponentStatus component_status;
  ON_ModelComponent *pOStack_10;
  bool bHiddenState_local;
  ON_ModelComponent *this_local;
  
  local_11 = bHiddenState;
  pOStack_10 = this;
  local_13 = ModelComponentStatus(this);
  bVar1 = (bool)(local_11 & 1);
  bVar2 = ON_ComponentStatus::IsHidden(&local_13);
  if (bVar1 != bVar2) {
    ON_ComponentStatus::SetHiddenState(&local_13,(bool)(local_11 & 1));
    bVar1 = SetModelComponentStatus(this,local_13);
    if (!bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x97f,"","cannot change component hidden state.");
    }
  }
  return;
}

Assistant:

void ON_ModelComponent::SetHiddenModelComponentState(
  bool bHiddenState
  )
{
  ON_ComponentStatus component_status = ModelComponentStatus();
  if (bHiddenState != component_status.IsHidden())
  {
    component_status.SetHiddenState(bHiddenState);
    if (false == SetModelComponentStatus(component_status))
    {
      ON_ERROR("cannot change component hidden state.");
    }
  }
}